

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verification_utils.hpp
# Opt level: O0

certificate_chain __thiscall
boost::certify::certificate_chain::from_file(certificate_chain *this,path *chain_path)

{
  bool bVar1;
  int iVar2;
  char *filename;
  BIO *pBVar3;
  stack_st_X509 *sk;
  X509 *ptr;
  X509 *pXVar4;
  OPENSSL_STACK *pOVar5;
  int ret;
  X509 *cert;
  stack_st_X509 *certs;
  unique_ptr<bio_st,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_djarek[P]certify_tests____tests_extras_include_boost_certify_verification_utils_hpp:37:31)>
  file;
  anon_class_1_0_00000001 bio_free;
  path *chain_path_local;
  
  filesystem::path::string_abi_cxx11_(chain_path);
  filename = (char *)std::__cxx11::string::c_str();
  pBVar3 = BIO_new_file(filename,"rb");
  std::
  unique_ptr<bio_st,boost::certify::certificate_chain::from_file(boost::filesystem::path_const&)::{lambda(bio_st*)#1}const>
  ::
  unique_ptr<boost::certify::certificate_chain::from_file(boost::filesystem::path_const&)::_lambda(bio_st*)_1_const,void>
            ((unique_ptr<bio_st,boost::certify::certificate_chain::from_file(boost::filesystem::path_const&)::_lambda(bio_st*)_1_const>
              *)&certs,(pointer)pBVar3,
             (deleter_type *)
             ((long)&file._M_t.
                     super___uniq_ptr_impl<bio_st,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_djarek[P]certify_tests____tests_extras_include_boost_certify_verification_utils_hpp:37:31)>
                     ._M_t.
                     super__Tuple_impl<0UL,_bio_st_*,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_djarek[P]certify_tests____tests_extras_include_boost_certify_verification_utils_hpp:37:31)>
                     .super__Head_base<0UL,_bio_st_*,_false>._M_head_impl + 7));
  bVar1 = std::operator!=((unique_ptr<bio_st,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_djarek[P]certify_tests____tests_extras_include_boost_certify_verification_utils_hpp:37:31)>
                           *)&certs,(nullptr_t)0x0);
  if (!bVar1) {
    __assert_fail("file != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/djarek[P]certify/tests/../tests/extras/include/boost/certify/verification_utils.hpp"
                  ,0x28,
                  "static certificate_chain boost::certify::certificate_chain::from_file(const boost::filesystem::path &)"
                 );
  }
  sk = (stack_st_X509 *)OPENSSL_sk_new_null();
  if (sk != (stack_st_X509 *)0x0) {
    do {
      pBVar3 = (BIO *)std::
                      unique_ptr<bio_st,_const_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/djarek[P]certify/tests/../tests/extras/include/boost/certify/verification_utils.hpp:37:31)>
                      ::get((unique_ptr<bio_st,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_djarek[P]certify_tests____tests_extras_include_boost_certify_verification_utils_hpp:37:31)>
                             *)&certs);
      ptr = PEM_read_bio_X509_AUX(pBVar3,(X509 **)0x0,(undefined1 *)0x0,(void *)0x0);
      if (ptr == (X509 *)0x0) {
        ERR_clear_error();
        pOVar5 = ossl_check_const_X509_sk_type(sk);
        iVar2 = OPENSSL_sk_num(pOVar5);
        if (iVar2 < 1) {
          __assert_fail("sk_X509_num(certs) > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/djarek[P]certify/tests/../tests/extras/include/boost/certify/verification_utils.hpp"
                        ,0x37,
                        "static certificate_chain boost::certify::certificate_chain::from_file(const boost::filesystem::path &)"
                       );
        }
        certificate_chain(this,sk);
        std::
        unique_ptr<bio_st,_const_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/djarek[P]certify/tests/../tests/extras/include/boost/certify/verification_utils.hpp:37:31)>
        ::~unique_ptr((unique_ptr<bio_st,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_djarek[P]certify_tests____tests_extras_include_boost_certify_verification_utils_hpp:37:31)>
                       *)&certs);
        return (unique_ptr<stack_st_X509,_boost::certify::certificate_chain::chain_free>)
               (unique_ptr<stack_st_X509,_boost::certify::certificate_chain::chain_free>)this;
      }
      pOVar5 = ossl_check_X509_sk_type(sk);
      pXVar4 = ossl_check_X509_type((X509 *)ptr);
      iVar2 = OPENSSL_sk_push(pOVar5,pXVar4);
    } while (iVar2 != 0);
    __assert_fail("ret != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/djarek[P]certify/tests/../tests/extras/include/boost/certify/verification_utils.hpp"
                  ,0x35,
                  "static certificate_chain boost::certify::certificate_chain::from_file(const boost::filesystem::path &)"
                 );
  }
  __assert_fail("certs != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/djarek[P]certify/tests/../tests/extras/include/boost/certify/verification_utils.hpp"
                ,0x2a,
                "static certificate_chain boost::certify::certificate_chain::from_file(const boost::filesystem::path &)"
               );
}

Assistant:

static certificate_chain from_file(
      boost::filesystem::path const& chain_path)
    {
        auto const bio_free = [](::BIO* b) { ::BIO_free(b); };
        std::unique_ptr<::BIO, decltype(bio_free)> file{
          ::BIO_new_file(chain_path.string().c_str(), "rb"), bio_free};
        assert(file != nullptr);
        auto* certs = sk_X509_new_null();
        assert(certs != nullptr);
        while (1)
        {
            auto* cert =
              ::PEM_read_bio_X509_AUX(file.get(), nullptr, nullptr, nullptr);
            if (!cert)
            {
                ::ERR_clear_error();
                break;
            }
            auto ret = sk_X509_push(certs, cert);
            assert(ret != 0);
        }
        assert(sk_X509_num(certs) > 0);

        return certificate_chain{certs};
    }